

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3GenerateColumnNames(Parse *pParse,Select *pSelect)

{
  ushort uVar1;
  sqlite3 *db;
  Vdbe *pVVar2;
  ExprList *pEVar3;
  SrcList *pSVar4;
  ulong uVar5;
  Expr *pEVar6;
  Table *pTVar7;
  ulong uVar8;
  char *pcVar9;
  int idx;
  ExprList_item *pEVar10;
  Select *pSVar11;
  code *xDel;
  long lVar12;
  ExprList_item *pEVar13;
  long in_FS_OFFSET;
  char *local_88;
  char *zOrigTab;
  char *zOrigDb;
  undefined1 local_70 [40];
  undefined1 *puStack_48;
  Select *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pParse->colNamesSet == '\0') {
    db = pParse->db;
    pVVar2 = pParse->pVdbe;
    do {
      pSVar11 = pSelect;
      pSelect = pSVar11->pPrior;
    } while (pSVar11->pPrior != (Select *)0x0);
    pEVar3 = pSVar11->pEList;
    pSVar4 = pSVar11->pSrc;
    pParse->colNamesSet = '\x01';
    uVar5 = db->flags;
    sqlite3VdbeSetNumCols(pVVar2,pEVar3->nExpr);
    pEVar10 = pEVar3->a;
    pEVar13 = pEVar10;
    for (lVar12 = 0; uVar8 = (ulong)pEVar3->nExpr, lVar12 < (long)uVar8; lVar12 = lVar12 + 1) {
      pEVar6 = pEVar13->pExpr;
      pcVar9 = pEVar13->zEName;
      if ((pcVar9 == (char *)0x0) || (((pEVar13->fg).field_0x1 & 3) != 0)) {
        if (((uVar5 & 0x44) == 0) || (pEVar6->op != 0xa8)) {
          if (pcVar9 == (char *)0x0) {
            pcVar9 = sqlite3MPrintf(db,"column%d",(ulong)((int)lVar12 + 1));
          }
          else {
            pcVar9 = sqlite3DbStrDup(db,pcVar9);
          }
        }
        else {
          uVar1 = pEVar6->iColumn;
          pTVar7 = (pEVar6->y).pTab;
          if ((short)uVar1 < 0) {
            uVar1 = pTVar7->iPKey;
            pcVar9 = "rowid";
            if (-1 < (short)uVar1) goto LAB_0017f559;
          }
          else {
LAB_0017f559:
            pcVar9 = pTVar7->aCol[uVar1].zCnName;
          }
          if ((uVar5 & 4) == 0) goto LAB_0017f56d;
          pcVar9 = sqlite3MPrintf(db,"%s.%s",pTVar7->zName);
        }
        xDel = sqlite3OomClear;
      }
      else {
LAB_0017f56d:
        xDel = (_func_void_void_ptr *)0xffffffffffffffff;
      }
      sqlite3VdbeSetColName(pVVar2,(int)lVar12,0,pcVar9,xDel);
      pEVar13 = pEVar13 + 1;
    }
    pVVar2 = pParse->pVdbe;
    local_70._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
    local_70._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_70._24_8_ = (NameContext *)0x0;
    local_70._0_8_ = pParse;
    local_70._8_8_ = pSVar4;
    for (lVar12 = 0; lVar12 < (int)uVar8; lVar12 = lVar12 + 1) {
      zOrigDb = (char *)0x0;
      zOrigTab = (char *)0x0;
      local_88 = (char *)0x0;
      pcVar9 = columnTypeImpl((NameContext *)local_70,pEVar10->pExpr,&zOrigDb,&zOrigTab,&local_88);
      idx = (int)lVar12;
      sqlite3VdbeSetColName(pVVar2,idx,2,zOrigDb,(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3VdbeSetColName(pVVar2,idx,3,zOrigTab,(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3VdbeSetColName(pVVar2,idx,4,local_88,(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3VdbeSetColName(pVVar2,idx,1,pcVar9,(_func_void_void_ptr *)0xffffffffffffffff);
      uVar8 = (ulong)(uint)pEVar3->nExpr;
      pEVar10 = pEVar10 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  TREETRACE(0x80,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN
        || (ExprUseYTab(p) && p->y.pTab!=0) ); /* Covering idx not yet coded */
    if( pEList->a[i].zEName && pEList->a[i].fg.eEName==ENAME_NAME ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zEName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zCnName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zEName;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}